

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<float>::CheckTypeCompatibility
          (TPZFMatrix<float> *this,TPZMatrix<float> *A,TPZMatrix<float> *B)

{
  long in_RDX;
  long in_RSI;
  TPZFMatrix<float> *bPtr;
  TPZFMatrix<float> *aPtr;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  long local_48;
  long local_38;
  
  if (in_RSI == 0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(in_RSI,&TPZMatrix<float>::typeinfo,&typeinfo,0);
  }
  if (in_RDX == 0) {
    local_48 = 0;
  }
  else {
    local_48 = __dynamic_cast(in_RDX,&TPZMatrix<float>::typeinfo,&typeinfo,0);
  }
  if ((local_38 == 0) || (local_48 == 0)) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZFMatrix<float>::CheckTypeCompatibility(const TPZMatrix<TVar> *, const TPZMatrix<TVar> *) const [TVar = float]"
                   );
    std::operator<<((ostream *)&std::cerr,"\nERROR: incompatible matrices.Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  return;
}

Assistant:

inline void CheckTypeCompatibility(const TPZMatrix<TVar>*A,
                                       const TPZMatrix<TVar>*B)const override
    {
        auto aPtr = dynamic_cast<const TPZFMatrix<TVar>*>(A);
        auto bPtr = dynamic_cast<const TPZFMatrix<TVar>*>(B);
        if(!aPtr || !bPtr){
            PZError<<__PRETTY_FUNCTION__;
            PZError<<"\nERROR: incompatible matrices.Aborting...\n";
            DebugStop();
        }
    }